

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cc
# Opt level: O2

bool __thiscall re2c::Opt::output(Opt *this,char *s)

{
  char *pcVar1;
  
  pcVar1 = this->output_file;
  if (pcVar1 == (char *)0x0) {
    this->output_file = s;
  }
  else {
    error("multiple output files: %s, %s",pcVar1);
  }
  return pcVar1 == (char *)0x0;
}

Assistant:

bool Opt::output (const char * s)
{
	if (output_file)
	{
		error ("multiple output files: %s, %s", output_file, s);
		return false;
	}
	else
	{
		output_file = s;
		return true;
	}
}